

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testExtendByBox<Imath_2_5::Vec2<float>>(char *type)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type sVar5;
  Box<Imath_2_5::Vec2<float>_> *pBVar6;
  reference v;
  float *pfVar7;
  char *in_RDI;
  float fVar8;
  uint k_1;
  uint k;
  Vec2<float> p1_1;
  Vec2<float> p0_1;
  uint i_1;
  Vec2<float> max;
  Vec2<float> min;
  Box<Imath_2_5::Vec2<float>_> b_1;
  uint iters;
  Rand32 rand;
  Box<Imath_2_5::Vec2<float>_> b1;
  Box<Imath_2_5::Vec2<float>_> b0;
  Vec2<float> p1;
  Vec2<float> p0;
  uint j;
  uint i;
  vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_> perms;
  Box<Imath_2_5::Vec2<float>_> b;
  float in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  Box<Imath_2_5::Vec2<float>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  Box<Imath_2_5::Vec2<float>_> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb8;
  uint uVar9;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  Box<Imath_2_5::Vec2<float>_> *in_stack_fffffffffffffec0;
  vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_> *perms_00;
  bool local_111;
  uint local_100;
  uint local_fc;
  Vec2<float> local_f8;
  Vec2<float> local_f0;
  uint local_e8;
  Vec2<float> local_e4;
  Vec2<float> local_dc;
  Vec2<float> local_d4;
  Vec2<float> VStack_cc;
  undefined4 local_c4;
  Vec2<float> local_a4;
  Vec2<float> aVStack_9c [3];
  Vec2<float> local_84;
  Vec2<float> VStack_7c;
  Vec2<float> local_74;
  Vec2<float> local_6c;
  uint local_64;
  uint local_60;
  vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_> local_50;
  Vec2<float> local_38;
  Vec2<float> local_30 [3];
  Vec2<float> local_18;
  Vec2<float> VStack_10;
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box(in_stack_fffffffffffffe90);
  Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box(in_stack_fffffffffffffe90);
  Imath_2_5::Box<Imath_2_5::Vec2<float>_>::extendBy
            (in_stack_fffffffffffffec0,
             (Box<Imath_2_5::Vec2<float>_> *)
             CONCAT17(in_stack_fffffffffffffebf,
                      CONCAT16(in_stack_fffffffffffffebe,
                               CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))));
  fVar8 = Imath_2_5::Vec2<float>::baseTypeMax();
  Imath_2_5::Vec2<float>::Vec2(local_30,fVar8);
  bVar1 = Imath_2_5::Vec2<float>::operator==(&local_18,local_30);
  local_111 = false;
  if (bVar1) {
    fVar8 = Imath_2_5::Vec2<float>::baseTypeMin();
    Imath_2_5::Vec2<float>::Vec2(&local_38,fVar8);
    local_111 = Imath_2_5::Vec2<float>::operator==(&VStack_10,&local_38);
  }
  if (local_111 == false) {
    __assert_fail("b.min == T(T::baseTypeMax()) && b.max == T(T::baseTypeMin())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x133,
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec2<float>]"
                 );
  }
  perms_00 = &local_50;
  std::vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_>::vector
            ((vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_> *)0x111616);
  permutations<Imath_2_5::Vec2<float>>(perms_00);
  local_60 = 0;
  do {
    uVar4 = (ulong)local_60;
    sVar5 = std::vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_>::size
                      (&local_50);
    if (sVar5 <= uVar4) {
      std::vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_>::~vector
                ((vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_> *)
                 in_stack_fffffffffffffea0);
      Imath_2_5::Rand32::Rand32
                ((Rand32 *)in_stack_fffffffffffffe90,
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_c4 = 10;
      Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box(in_stack_fffffffffffffe90);
      Imath_2_5::Vec2<float>::Vec2(&local_dc);
      Imath_2_5::Vec2<float>::Vec2(&local_e4);
      local_e8 = 1;
      while( true ) {
        if (9 < local_e8) {
          return;
        }
        Imath_2_5::Vec2<float>::Vec2(&local_f0);
        Imath_2_5::Vec2<float>::Vec2(&local_f8);
        local_fc = 0;
        while (uVar9 = local_fc, uVar2 = Imath_2_5::Vec2<float>::dimensions(), uVar9 < uVar2) {
          fVar8 = Imath_2_5::Rand32::nextf
                            ((Rand32 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                             in_stack_fffffffffffffe88);
          pfVar7 = Imath_2_5::Vec2<float>::operator[](&local_f0,local_fc);
          *pfVar7 = fVar8;
          fVar8 = Imath_2_5::Rand32::nextf
                            ((Rand32 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                             in_stack_fffffffffffffe88);
          pfVar7 = Imath_2_5::Vec2<float>::operator[](&local_f8,local_fc);
          *pfVar7 = fVar8;
          local_fc = local_fc + 1;
        }
        Imath_2_5::Vec2<float>::operator=(&local_dc,&local_d4);
        Imath_2_5::Vec2<float>::operator=(&local_e4,&VStack_cc);
        for (local_100 = 0; uVar2 = Imath_2_5::Vec2<float>::dimensions(), local_100 < uVar2;
            local_100 = local_100 + 1) {
          in_stack_fffffffffffffe90 =
               (Box<Imath_2_5::Vec2<float>_> *)
               Imath_2_5::Vec2<float>::operator[](&local_dc,local_100);
          pfVar7 = Imath_2_5::Vec2<float>::operator[](&local_f0,local_100);
          pfVar7 = std::min<float>((float *)in_stack_fffffffffffffe90,pfVar7);
          in_stack_fffffffffffffe9c = *pfVar7;
          pfVar7 = Imath_2_5::Vec2<float>::operator[](&local_dc,local_100);
          *pfVar7 = in_stack_fffffffffffffe9c;
          in_stack_fffffffffffffea0 =
               (Box<Imath_2_5::Vec2<float>_> *)
               Imath_2_5::Vec2<float>::operator[](&local_e4,local_100);
          pfVar7 = Imath_2_5::Vec2<float>::operator[](&local_f8,local_100);
          pfVar7 = std::max<float>((float *)in_stack_fffffffffffffea0,pfVar7);
          fVar8 = *pfVar7;
          pfVar7 = Imath_2_5::Vec2<float>::operator[](&local_e4,local_100);
          *pfVar7 = fVar8;
        }
        Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box
                  (in_stack_fffffffffffffea0,
                   (Vec2<float> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   &in_stack_fffffffffffffe90->min);
        Imath_2_5::Box<Imath_2_5::Vec2<float>_>::extendBy
                  (in_stack_fffffffffffffec0,
                   (Box<Imath_2_5::Vec2<float>_> *)
                   CONCAT17(in_stack_fffffffffffffebf,
                            CONCAT16(in_stack_fffffffffffffebe,
                                     CONCAT24(in_stack_fffffffffffffebc,uVar9))));
        bVar1 = Imath_2_5::Vec2<float>::operator==(&local_d4,&local_dc);
        in_stack_fffffffffffffe8c = (float)((uint)in_stack_fffffffffffffe8c & 0xffffff);
        if (bVar1) {
          bVar1 = Imath_2_5::Vec2<float>::operator==(&VStack_cc,&local_e4);
          in_stack_fffffffffffffe8c = (float)CONCAT13(bVar1,SUB43(in_stack_fffffffffffffe8c,0));
        }
        if ((char)((uint)in_stack_fffffffffffffe8c >> 0x18) == '\0') break;
        local_e8 = local_e8 + 1;
      }
      __assert_fail("b.min == min && b.max == max",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                    ,0x16c,
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec2<float>]"
                   );
    }
    local_64 = 0;
    while( true ) {
      in_stack_fffffffffffffec0 = (Box<Imath_2_5::Vec2<float>_> *)(ulong)local_64;
      pBVar6 = (Box<Imath_2_5::Vec2<float>_> *)
               std::vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_>::size
                         (&local_50);
      if (pBVar6 <= in_stack_fffffffffffffec0) break;
      std::vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_>::operator[]
                (&local_50,(ulong)local_60);
      Imath_2_5::Vec2<float>::operator-
                ((Vec2<float> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      v = std::vector<Imath_2_5::Vec2<float>,_std::allocator<Imath_2_5::Vec2<float>_>_>::operator[]
                    (&local_50,(ulong)local_64);
      Imath_2_5::Vec2<float>::Vec2(&local_74,v);
      Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box(in_stack_fffffffffffffe90);
      Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box
                (in_stack_fffffffffffffea0,
                 (Vec2<float> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 &in_stack_fffffffffffffe90->min);
      Imath_2_5::Box<Imath_2_5::Vec2<float>_>::extendBy
                (in_stack_fffffffffffffec0,
                 (Box<Imath_2_5::Vec2<float>_> *)
                 CONCAT17(in_stack_fffffffffffffebf,
                          CONCAT16(in_stack_fffffffffffffebe,
                                   CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))));
      bVar1 = Imath_2_5::Vec2<float>::operator==(&local_84,&local_6c);
      in_stack_fffffffffffffebf = false;
      if (bVar1) {
        in_stack_fffffffffffffebf = Imath_2_5::Vec2<float>::operator==(&VStack_7c,&local_74);
      }
      if ((bool)in_stack_fffffffffffffebf == false) {
        __assert_fail("b0.min == p0 && b0.max == p1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                      ,0x146,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec2<float>]"
                     );
      }
      Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box
                (in_stack_fffffffffffffea0,
                 (Vec2<float> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 &in_stack_fffffffffffffe90->min);
      Imath_2_5::Box<Imath_2_5::Vec2<float>_>::Box(in_stack_fffffffffffffe90);
      Imath_2_5::Box<Imath_2_5::Vec2<float>_>::extendBy
                (in_stack_fffffffffffffec0,
                 (Box<Imath_2_5::Vec2<float>_> *)
                 CONCAT17(in_stack_fffffffffffffebf,
                          CONCAT16(in_stack_fffffffffffffebe,
                                   CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8))));
      bVar1 = Imath_2_5::Vec2<float>::operator==(&local_a4,&local_6c);
      in_stack_fffffffffffffebe = false;
      if (bVar1) {
        in_stack_fffffffffffffebe = Imath_2_5::Vec2<float>::operator==(aVStack_9c,&local_74);
      }
      if ((bool)in_stack_fffffffffffffebe == false) {
        __assert_fail("b1.min == p0 && b1.max == p1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                      ,0x14a,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_2_5::Vec2<float>]"
                     );
      }
      local_64 = local_64 + 1;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void
testExtendByBox(const char *type)
{
    cout << "    extendBy() box for type " << type << endl;

    //
    // Extend empty box with an empty box;
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>());
        assert(b.min == T(T::baseTypeMax()) &&
               b.max == T(T::baseTypeMin()));
    }

    //
    // Extend empty box with a non-empty box and vice versa.
    //
    {
        std::vector<T> perms;
        permutations(perms);

        for (unsigned int i = 0; i < perms.size(); i++)
        {
            for (unsigned int j = 0; j < perms.size(); j++)
            {
                T p0 = -perms[i];
                T p1 =  perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                b0.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>(p0, p1));
                assert(b0.min == p0 && b0.max == p1);

                IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
                b1.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>());
                assert(b1.min == p0 && b1.max == p1);
            }
        }
    }
        
    //
    // Extend non-empty box with non-empty box. Starts with empty, then builds.
    //
    IMATH_INTERNAL_NAMESPACE::Rand32 rand(0);
    const unsigned int iters = 10;
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;

        T min, max;

        for (unsigned int i = 1; i < iters; i++)
        {
            T p0;
            T p1;
            for (unsigned int k = 0; k < T::dimensions(); k++)
            {
                p0[k] = typename T::BaseType (rand.nextf(   0,  999));
                p1[k] = typename T::BaseType (rand.nextf(1000, 1999));
            }

            min = b.min;
            max = b.max;
            for (unsigned int k = 0; k < T::dimensions(); k++)
            {
                min[k] = std::min(min[k], p0[k]);
                max[k] = std::max(max[k], p1[k]);
            }
            b.extendBy(IMATH_INTERNAL_NAMESPACE::Box<T>(p0, p1));

            assert(b.min == min && b.max == max);
        }
    }
}